

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesCacheEntryComposite.cxx
# Opt level: O0

void __thiscall
cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
          (cmCursesCacheEntryComposite *this,string *key,cmState *state,bool isNew,int labelwidth,
          int entrywidth)

{
  cmState *this_00;
  cmState *key_00;
  bool bVar1;
  CacheEntryType CVar2;
  pointer this_01;
  pointer this_02;
  cmCursesStringWidget *this_03;
  pointer pcVar3;
  pointer this_04;
  string *psVar4;
  string_view sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined4 local_18c;
  int local_188 [2];
  unique_ptr<cmCursesStringWidget,_std::default_delete<cmCursesStringWidget>_> local_180;
  __single_object sw;
  string *opt;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  int local_128 [2];
  unique_ptr<cmCursesOptionsWidget,_std::default_delete<cmCursesOptionsWidget>_> local_120;
  __single_object ow;
  string local_110;
  cmValue local_f0;
  cmValue stringsProp;
  int local_e0 [2];
  unique_ptr<cmCursesFilePathWidget,_std::default_delete<cmCursesFilePathWidget>_> local_d8;
  __single_object fpw;
  int local_c8 [2];
  unique_ptr<cmCursesPathWidget,_std::default_delete<cmCursesPathWidget>_> local_c0;
  __single_object pw;
  int local_a0 [2];
  unique_ptr<cmCursesBoolWidget,_std::default_delete<cmCursesBoolWidget>_> local_98;
  __single_object bw;
  cmValue value;
  int local_80 [2];
  unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_> local_78;
  char local_70 [4];
  int local_6c [3];
  unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_54;
  int local_2c;
  int local_28;
  int entrywidth_local;
  int labelwidth_local;
  bool isNew_local;
  cmState *state_local;
  string *key_local;
  cmCursesCacheEntryComposite *this_local;
  
  local_2c = entrywidth;
  local_28 = labelwidth;
  entrywidth_local._3_1_ = isNew;
  _labelwidth_local = state;
  state_local = (cmState *)key;
  key_local = (string *)this;
  std::unique_ptr<cmCursesLabelWidget,std::default_delete<cmCursesLabelWidget>>::
  unique_ptr<std::default_delete<cmCursesLabelWidget>,void>
            ((unique_ptr<cmCursesLabelWidget,std::default_delete<cmCursesLabelWidget>> *)this);
  std::unique_ptr<cmCursesLabelWidget,std::default_delete<cmCursesLabelWidget>>::
  unique_ptr<std::default_delete<cmCursesLabelWidget>,void>
            ((unique_ptr<cmCursesLabelWidget,std::default_delete<cmCursesLabelWidget>> *)
             &this->IsNewLabel);
  std::unique_ptr<cmCursesWidget,std::default_delete<cmCursesWidget>>::
  unique_ptr<std::default_delete<cmCursesWidget>,void>
            ((unique_ptr<cmCursesWidget,std::default_delete<cmCursesWidget>> *)&this->Entry);
  std::__cxx11::string::string((string *)&this->Key,(string *)state_local);
  this->LabelWidth = local_28;
  this->EntryWidth = local_2c;
  local_54._M_string_length._0_4_ = 1;
  local_54._4_4_ = 1;
  local_54._M_dataplus = (_Alloc_hider)0x1;
  local_54._1_3_ = 0;
  std::make_unique<cmCursesLabelWidget,int&,int,int,int,std::__cxx11::string_const&>
            ((int *)((long)&local_54._M_string_length + 4),&this->LabelWidth,
             (int *)&local_54._M_string_length,(int *)&local_54.field_0x4,&local_54);
  std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::operator=
            (&this->Label,
             (unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_> *)
             ((long)&local_54._M_string_length + 4));
  std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::~unique_ptr
            ((unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_> *)
             ((long)&local_54._M_string_length + 4));
  if ((entrywidth_local._3_1_ & 1) == 0) {
    local_80[1] = 1;
    local_80[0] = 1;
    value.Value._4_4_ = 1;
    value.Value._0_4_ = 1;
    std::make_unique<cmCursesLabelWidget,int,int,int,int,char_const(&)[2]>
              ((int *)&local_78,local_80 + 1,local_80,(int *)((long)&value.Value + 4),
               (char (*) [2])&value);
    std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::operator=
              (&this->IsNewLabel,&local_78);
    std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::~unique_ptr
              (&local_78);
  }
  else {
    local_6c[2] = 1;
    local_6c[1] = 1;
    local_6c[0] = 1;
    local_70[0] = '\x01';
    local_70[1] = '\0';
    local_70[2] = '\0';
    local_70[3] = '\0';
    std::make_unique<cmCursesLabelWidget,int,int,int,int,char_const(&)[2]>
              ((int *)&local_60,local_6c + 2,local_6c + 1,local_6c,(char (*) [2])local_70);
    std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::operator=
              (&this->IsNewLabel,&local_60);
    std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::~unique_ptr
              (&local_60);
  }
  bw._M_t.super___uniq_ptr_impl<cmCursesBoolWidget,_std::default_delete<cmCursesBoolWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesBoolWidget_*,_std::default_delete<cmCursesBoolWidget>_>.
  super__Head_base<0UL,_cmCursesBoolWidget_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCursesBoolWidget,_std::default_delete<cmCursesBoolWidget>,_true,_true>)
       cmState::GetCacheEntryValue(_labelwidth_local,(string *)state_local);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)&bw);
  if (bVar1) {
    CVar2 = cmState::GetCacheEntryType(_labelwidth_local,(string *)state_local);
    key_00 = state_local;
    this_00 = _labelwidth_local;
    switch(CVar2) {
    case BOOL:
      local_a0[1] = 1;
      local_a0[0] = 1;
      std::make_unique<cmCursesBoolWidget,int&,int,int,int>
                ((int *)&local_98,&this->EntryWidth,local_a0 + 1,local_a0);
      this_01 = std::unique_ptr<cmCursesBoolWidget,_std::default_delete<cmCursesBoolWidget>_>::
                operator->(&local_98);
      psVar4 = cmValue::operator*[abi_cxx11_((cmValue *)&bw);
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
      pw._M_t.super___uniq_ptr_impl<cmCursesPathWidget,_std::default_delete<cmCursesPathWidget>_>.
      _M_t.super__Tuple_impl<0UL,_cmCursesPathWidget_*,_std::default_delete<cmCursesPathWidget>_>.
      super__Head_base<0UL,_cmCursesPathWidget_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCursesPathWidget,_std::default_delete<cmCursesPathWidget>,_true,_true>
           )sVar5._M_len;
      bVar1 = cmIsOn(sVar5);
      cmCursesBoolWidget::SetValueAsBool(this_01,bVar1);
      std::unique_ptr<cmCursesWidget,std::default_delete<cmCursesWidget>>::operator=
                ((unique_ptr<cmCursesWidget,std::default_delete<cmCursesWidget>> *)&this->Entry,
                 &local_98);
      std::unique_ptr<cmCursesBoolWidget,_std::default_delete<cmCursesBoolWidget>_>::~unique_ptr
                (&local_98);
      break;
    case PATH:
      local_c8[1] = 1;
      local_c8[0] = 1;
      fpw._M_t.
      super___uniq_ptr_impl<cmCursesFilePathWidget,_std::default_delete<cmCursesFilePathWidget>_>.
      _M_t.
      super__Tuple_impl<0UL,_cmCursesFilePathWidget_*,_std::default_delete<cmCursesFilePathWidget>_>
      .super__Head_base<0UL,_cmCursesFilePathWidget_*,_false>._M_head_impl._4_4_ = 1;
      std::make_unique<cmCursesPathWidget,int&,int,int,int>
                ((int *)&local_c0,&this->EntryWidth,local_c8 + 1,local_c8);
      this_02 = std::unique_ptr<cmCursesPathWidget,_std::default_delete<cmCursesPathWidget>_>::
                operator->(&local_c0);
      psVar4 = cmValue::operator*[abi_cxx11_((cmValue *)&bw);
      cmCursesStringWidget::SetString(&this_02->super_cmCursesStringWidget,psVar4);
      std::unique_ptr<cmCursesWidget,std::default_delete<cmCursesWidget>>::operator=
                ((unique_ptr<cmCursesWidget,std::default_delete<cmCursesWidget>> *)&this->Entry,
                 &local_c0);
      std::unique_ptr<cmCursesPathWidget,_std::default_delete<cmCursesPathWidget>_>::~unique_ptr
                (&local_c0);
      break;
    case FILEPATH:
      local_e0[1] = 1;
      local_e0[0] = 1;
      stringsProp.Value._4_4_ = 1;
      std::make_unique<cmCursesFilePathWidget,int&,int,int,int>
                ((int *)&local_d8,&this->EntryWidth,local_e0 + 1,local_e0);
      this_03 = (cmCursesStringWidget *)
                std::
                unique_ptr<cmCursesFilePathWidget,_std::default_delete<cmCursesFilePathWidget>_>::
                operator->(&local_d8);
      psVar4 = cmValue::operator*[abi_cxx11_((cmValue *)&bw);
      cmCursesStringWidget::SetString(this_03,psVar4);
      std::unique_ptr<cmCursesWidget,std::default_delete<cmCursesWidget>>::operator=
                ((unique_ptr<cmCursesWidget,std::default_delete<cmCursesWidget>> *)&this->Entry,
                 &local_d8);
      std::unique_ptr<cmCursesFilePathWidget,_std::default_delete<cmCursesFilePathWidget>_>::
      ~unique_ptr(&local_d8);
      break;
    case STRING:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"STRINGS",
                 (allocator<char> *)
                 ((long)&ow._M_t.
                         super___uniq_ptr_impl<cmCursesOptionsWidget,_std::default_delete<cmCursesOptionsWidget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCursesOptionsWidget_*,_std::default_delete<cmCursesOptionsWidget>_>
                         .super__Head_base<0UL,_cmCursesOptionsWidget_*,_false>._M_head_impl + 7));
      local_f0 = cmState::GetCacheEntryProperty(this_00,(string *)key_00,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&ow._M_t.
                         super___uniq_ptr_impl<cmCursesOptionsWidget,_std::default_delete<cmCursesOptionsWidget>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCursesOptionsWidget_*,_std::default_delete<cmCursesOptionsWidget>_>
                         .super__Head_base<0UL,_cmCursesOptionsWidget_*,_false>._M_head_impl + 7));
      bVar1 = cmValue::operator_cast_to_bool(&local_f0);
      if (bVar1) {
        local_128[1] = 1;
        local_128[0] = 1;
        __range3._4_4_ = 1;
        std::make_unique<cmCursesOptionsWidget,int&,int,int,int>
                  ((int *)&local_120,&this->EntryWidth,local_128 + 1,local_128);
        psVar4 = cmValue::operator*[abi_cxx11_(&local_f0);
        sVar5 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
        cmExpandedList_abi_cxx11_(&local_150,sVar5,false);
        local_138 = &local_150;
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(local_138);
        opt = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(local_138);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&opt), bVar1) {
          sw._M_t.
          super___uniq_ptr_impl<cmCursesStringWidget,_std::default_delete<cmCursesStringWidget>_>.
          _M_t.
          super__Tuple_impl<0UL,_cmCursesStringWidget_*,_std::default_delete<cmCursesStringWidget>_>
          .super__Head_base<0UL,_cmCursesStringWidget_*,_false>._M_head_impl =
               (__uniq_ptr_data<cmCursesStringWidget,_std::default_delete<cmCursesStringWidget>,_true,_true>
                )__gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
          pcVar3 = std::
                   unique_ptr<cmCursesOptionsWidget,_std::default_delete<cmCursesOptionsWidget>_>::
                   operator->(&local_120);
          cmCursesOptionsWidget::AddOption
                    (pcVar3,(string *)
                            sw._M_t.
                            super___uniq_ptr_impl<cmCursesStringWidget,_std::default_delete<cmCursesStringWidget>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCursesStringWidget_*,_std::default_delete<cmCursesStringWidget>_>
                            .super__Head_base<0UL,_cmCursesStringWidget_*,_false>._M_head_impl);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_150);
        pcVar3 = std::unique_ptr<cmCursesOptionsWidget,_std::default_delete<cmCursesOptionsWidget>_>
                 ::operator->(&local_120);
        psVar4 = cmValue::operator*[abi_cxx11_((cmValue *)&bw);
        cmCursesOptionsWidget::SetOption(pcVar3,psVar4);
        std::unique_ptr<cmCursesWidget,std::default_delete<cmCursesWidget>>::operator=
                  ((unique_ptr<cmCursesWidget,std::default_delete<cmCursesWidget>> *)&this->Entry,
                   &local_120);
        std::unique_ptr<cmCursesOptionsWidget,_std::default_delete<cmCursesOptionsWidget>_>::
        ~unique_ptr(&local_120);
      }
      else {
        local_188[1] = 1;
        local_188[0] = 1;
        local_18c = 1;
        std::make_unique<cmCursesStringWidget,int&,int,int,int>
                  ((int *)&local_180,&this->EntryWidth,local_188 + 1,local_188);
        this_04 = std::unique_ptr<cmCursesStringWidget,_std::default_delete<cmCursesStringWidget>_>
                  ::operator->(&local_180);
        psVar4 = cmValue::operator*[abi_cxx11_((cmValue *)&bw);
        cmCursesStringWidget::SetString(this_04,psVar4);
        std::unique_ptr<cmCursesWidget,std::default_delete<cmCursesWidget>>::operator=
                  ((unique_ptr<cmCursesWidget,std::default_delete<cmCursesWidget>> *)&this->Entry,
                   &local_180);
        std::unique_ptr<cmCursesStringWidget,_std::default_delete<cmCursesStringWidget>_>::
        ~unique_ptr(&local_180);
      }
      break;
    default:
      break;
    case UNINITIALIZED:
      std::operator+(&local_1b0,"Found an undefined variable: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     state_local);
      cmSystemTools::Error(&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    return;
  }
  __assert_fail("value",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CursesDialog/cmCursesCacheEntryComposite.cxx"
                ,0x35,
                "cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(const std::string &, cmState *, bool, int, int)"
               );
}

Assistant:

cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(
  const std::string& key, cmState* state, bool isNew, int labelwidth,
  int entrywidth)
  : Key(key)
  , LabelWidth(labelwidth)
  , EntryWidth(entrywidth)
{
  this->Label =
    cm::make_unique<cmCursesLabelWidget>(this->LabelWidth, 1, 1, 1, key);
  if (isNew) {
    this->IsNewLabel = cm::make_unique<cmCursesLabelWidget>(1, 1, 1, 1, "*");
  } else {
    this->IsNewLabel = cm::make_unique<cmCursesLabelWidget>(1, 1, 1, 1, " ");
  }

  cmValue value = state->GetCacheEntryValue(key);
  assert(value);
  switch (state->GetCacheEntryType(key)) {
    case cmStateEnums::BOOL: {
      auto bw = cm::make_unique<cmCursesBoolWidget>(this->EntryWidth, 1, 1, 1);
      bw->SetValueAsBool(cmIsOn(*value));
      this->Entry = std::move(bw);
      break;
    }
    case cmStateEnums::PATH: {
      auto pw = cm::make_unique<cmCursesPathWidget>(this->EntryWidth, 1, 1, 1);
      pw->SetString(*value);
      this->Entry = std::move(pw);
      break;
    }
    case cmStateEnums::FILEPATH: {
      auto fpw =
        cm::make_unique<cmCursesFilePathWidget>(this->EntryWidth, 1, 1, 1);
      fpw->SetString(*value);
      this->Entry = std::move(fpw);
      break;
    }
    case cmStateEnums::STRING: {
      cmValue stringsProp = state->GetCacheEntryProperty(key, "STRINGS");
      if (stringsProp) {
        auto ow =
          cm::make_unique<cmCursesOptionsWidget>(this->EntryWidth, 1, 1, 1);
        for (std::string const& opt : cmExpandedList(*stringsProp)) {
          ow->AddOption(opt);
        }
        ow->SetOption(*value);
        this->Entry = std::move(ow);
      } else {
        auto sw =
          cm::make_unique<cmCursesStringWidget>(this->EntryWidth, 1, 1, 1);
        sw->SetString(*value);
        this->Entry = std::move(sw);
      }
      break;
    }
    case cmStateEnums::UNINITIALIZED:
      cmSystemTools::Error("Found an undefined variable: " + key);
      break;
    default:
      // TODO : put warning message here
      break;
  }
}